

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O3

UnicodeSet * icu_63::unisets::get(Key key)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  Key extraout_EDX;
  Key extraout_EDX_00;
  Key KVar3;
  Key k3;
  code *pattern;
  char *size;
  UnicodeString *pUVar4;
  long lVar5;
  UErrorCode localStatus;
  ParseDataSink sink;
  LocalUResourceBundlePointer rb;
  UErrorCode local_74;
  UnicodeString local_70;
  ResourceSink local_30;
  LocalPointerBase<UResourceBundle> local_28;
  
  local_74 = U_ZERO_ERROR;
  if ((::(anonymous_namespace)::gNumberParseUniSetsInitOnce == 2) ||
     (UVar1 = umtx_initImplPreInit
                        ((UInitOnce *)&::(anonymous_namespace)::gNumberParseUniSetsInitOnce),
     UVar1 == '\0')) {
    if (U_ZERO_ERROR < DAT_003c321c) {
      return (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
    }
  }
  else {
    pattern = anon_unknown.dwarf_29c228::cleanupNumberParseUniSets;
    ucln_common_registerCleanup_63
              (UCLN_COMMON_NUMPARSE_UNISETS,anon_unknown.dwarf_29c228::cleanupNumberParseUniSets);
    UnicodeSet::UnicodeSet((UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet);
    UnicodeSet::freeze((UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet);
    ::(anonymous_namespace)::gEmptyUnicodeSetInitialized = 1;
    pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
    if (pUVar2 == (UnicodeSet *)0x0) {
      DAT_003c3238 = (UnicodeSet *)0x0;
    }
    else {
      UnicodeString::UnicodeString
                (&local_70,L"[[:Zs:][\\u0009][:Bidi_Control:][:Variation_Selector:]]");
      pattern = (code *)&local_70;
      UnicodeSet::UnicodeSet(pUVar2,(UnicodeString *)pattern,&local_74);
      DAT_003c3238 = pUVar2;
      UnicodeString::~UnicodeString(&local_70);
    }
    pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
    if (pUVar2 == (UnicodeSet *)0x0) {
      _DAT_003c3240 = (UnicodeSet *)0x0;
    }
    else {
      UnicodeString::UnicodeString(&local_70,L"[[:Bidi_Control:]]");
      UnicodeSet::UnicodeSet(pUVar2,&local_70,&local_74);
      _DAT_003c3240 = pUVar2;
      UnicodeString::~UnicodeString(&local_70);
    }
    local_28.ptr = ures_open_63((char *)0x0,"root",&local_74);
    if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_30.super_UObject._vptr_UObject = (UObject)&PTR__ResourceSink_003b6560;
      size = "parse";
      ures_getAllItemsWithFallback_63(local_28.ptr,"parse",&local_30,&local_74);
      if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
        if (pUVar2 == (UnicodeSet *)0x0) {
          DAT_003c3268 = (UnicodeSet *)0x0;
          KVar3 = extraout_EDX;
        }
        else {
          UnicodeString::UnicodeString
                    (&local_70,L"[\'٬‘’＇\\u0020\\u00A0\\u2000-\\u200A\\u202F\\u205F\\u3000]")
          ;
          UnicodeSet::UnicodeSet(pUVar2,&local_70,&local_74);
          DAT_003c3268 = pUVar2;
          UnicodeString::~UnicodeString(&local_70);
          KVar3 = extraout_EDX_00;
        }
        _DAT_003c3270 = anon_unknown.dwarf_29c228::computeUnion(COMMA,PERIOD,KVar3);
        pUVar4 = (UnicodeString *)0x6;
        _DAT_003c3278 = anon_unknown.dwarf_29c228::computeUnion(STRICT_COMMA,STRICT_PERIOD,k3);
        pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
        if (pUVar2 == (UnicodeSet *)0x0) {
          _DAT_003c3290 = (UnicodeSet *)0x0;
        }
        else {
          UnicodeString::UnicodeString(&local_70,L"[%٪]");
          pUVar4 = &local_70;
          UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_74);
          _DAT_003c3290 = pUVar2;
          UnicodeString::~UnicodeString(&local_70);
        }
        pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
        if (pUVar2 == (UnicodeSet *)0x0) {
          _DAT_003c3298 = (UnicodeSet *)0x0;
        }
        else {
          UnicodeString::UnicodeString(&local_70,L"[‰؉]");
          pUVar4 = &local_70;
          UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_74);
          _DAT_003c3298 = pUVar2;
          UnicodeString::~UnicodeString(&local_70);
        }
        pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
        if (pUVar2 == (UnicodeSet *)0x0) {
          _DAT_003c32a0 = (UnicodeSet *)0x0;
        }
        else {
          UnicodeString::UnicodeString(&local_70,L"[∞]");
          pUVar4 = &local_70;
          UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_74);
          _DAT_003c32a0 = pUVar2;
          UnicodeString::~UnicodeString(&local_70);
        }
        pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
        if (pUVar2 == (UnicodeSet *)0x0) {
          _DAT_003c32c0 = (UnicodeSet *)0x0;
        }
        else {
          UnicodeString::UnicodeString(&local_70,L"[¥\\uffe5]");
          pUVar4 = &local_70;
          UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_74);
          _DAT_003c32c0 = pUVar2;
          UnicodeString::~UnicodeString(&local_70);
        }
        pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
        KVar3 = (Key)pUVar4;
        if (pUVar2 == (UnicodeSet *)0x0) {
          DAT_003c32c8 = (UnicodeSet *)0x0;
        }
        else {
          UnicodeString::UnicodeString(&local_70,L"[:digit:]");
          pUVar4 = &local_70;
          UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_74);
          KVar3 = (Key)pUVar4;
          DAT_003c32c8 = pUVar2;
          UnicodeString::~UnicodeString(&local_70);
        }
        _DAT_003c32d0 = anon_unknown.dwarf_29c228::computeUnion(ALL_SEPARATORS,KVar3);
        _DAT_003c32d8 = anon_unknown.dwarf_29c228::computeUnion(STRICT_ALL_SEPARATORS,KVar3);
        lVar5 = 0;
        do {
          if (*(UnicodeSet **)((long)&::(anonymous_namespace)::gUnicodeSets + lVar5) !=
              (UnicodeSet *)0x0) {
            UnicodeSet::freeze(*(UnicodeSet **)
                                ((long)&::(anonymous_namespace)::gUnicodeSets + lVar5));
          }
          lVar5 = lVar5 + 8;
        } while (lVar5 != 0xb0);
      }
      ResourceSink::~ResourceSink(&local_30);
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_28);
    DAT_003c321c = local_74;
    umtx_initImplPostInit((UInitOnce *)&::(anonymous_namespace)::gNumberParseUniSetsInitOnce);
  }
  pUVar2 = (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
  if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar2 = (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
    if ((UnicodeSet *)(&::(anonymous_namespace)::gUnicodeSets)[key] != (UnicodeSet *)0x0) {
      pUVar2 = (UnicodeSet *)(&::(anonymous_namespace)::gUnicodeSets)[key];
    }
  }
  return pUVar2;
}

Assistant:

const UnicodeSet* unisets::get(Key key) {
    UErrorCode localStatus = U_ZERO_ERROR;
    umtx_initOnce(gNumberParseUniSetsInitOnce, &initNumberParseUniSets, localStatus);
    if (U_FAILURE(localStatus)) {
        return reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet);
    }
    return getImpl(key);
}